

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

int mraa_spi_lookup(char *spi_name)

{
  char *__s2;
  int iVar1;
  size_t sVar2;
  int local_1c;
  int i;
  char *spi_name_local;
  
  if (((plat != (mraa_board_t *)0x0) && (spi_name != (char *)0x0)) &&
     (sVar2 = strlen(spi_name), sVar2 != 0)) {
    local_1c = 0;
    do {
      if (plat->spi_bus_count <= local_1c) {
        return -1;
      }
      if (plat->spi_bus[local_1c].name != (char *)0x0) {
        __s2 = plat->spi_bus[local_1c].name;
        sVar2 = strlen(plat->spi_bus[local_1c].name);
        iVar1 = strncmp(spi_name,__s2,sVar2 + 1);
        if (iVar1 == 0) {
          return plat->spi_bus[local_1c].bus_id;
        }
      }
      local_1c = local_1c + 1;
    } while( true );
  }
  return -1;
}

Assistant:

int
mraa_spi_lookup(const char* spi_name)
{
    int i;

    if (plat == NULL) {
        return -1;
    }

    if (spi_name == NULL || strlen(spi_name) == 0) {
        return -1;
    }

    for (i = 0; i < plat->spi_bus_count; i++) {
        if (plat->spi_bus[i].name != NULL &&
            strncmp(spi_name, plat->spi_bus[i].name, strlen(plat->spi_bus[i].name) + 1) == 0) {
            return plat->spi_bus[i].bus_id;
        }
    }
    return -1;
}